

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall
btRigidBody::btRigidBody(btRigidBody *this,btRigidBodyConstructionInfo *constructionInfo)

{
  undefined8 *in_RDI;
  btCollisionObject *unaff_retaddr;
  btRigidBodyConstructionInfo *in_stack_00000058;
  btRigidBody *in_stack_00000060;
  btMatrix3x3 *in_stack_ffffffffffffffe0;
  
  btCollisionObject::btCollisionObject(unaff_retaddr);
  *in_RDI = &PTR__btRigidBody_002e7a80;
  btMatrix3x3::btMatrix3x3(in_stack_ffffffffffffffe0);
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x17c));
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x18c));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x34));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x36));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x38));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x3a));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x3c));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x3e));
  btAlignedObjectArray<btTypedConstraint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btTypedConstraint_*> *)(in_RDI + 0x46));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x4b));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x4d));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x4f));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x51));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x53));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x55));
  setupRigidBody(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

btRigidBody::btRigidBody(const btRigidBody::btRigidBodyConstructionInfo& constructionInfo)
{
	setupRigidBody(constructionInfo);
}